

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::receive(WebSocketImpl *this,size_t maxSize)

{
  _func_int *p_Var1;
  SourceLocation location;
  SourceLocation location_00;
  WebSocket WVar2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2937:17),_unsigned_long>
  PVar3;
  undefined8 uVar4;
  byte bVar5;
  Array<unsigned_char> *__begin4;
  ulong uVar6;
  void *pvVar7;
  byte bVar8;
  long lVar9;
  char *pcVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ulong uVar11;
  size_t sVar12;
  uchar *__dest;
  uint16_t code;
  byte *__dest_00;
  unsigned_long *in_R9;
  PromiseBase location_01;
  Array<unsigned_char> *fragment_1;
  anon_class_96_10_18673444_for_func *count;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar13;
  _func_int **pp_Var14;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2708:17)>
  *location_02;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2811:9)>
  *location_03;
  byte *__src;
  StringPtr reason;
  StringPtr reason_00;
  StringPtr reason_01;
  byte local_252;
  WebSocket local_250;
  undefined4 local_244;
  OwnPromiseNode intermediate;
  OwnPromiseNode intermediate_1;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2937:17),_unsigned_long>
  promise;
  Array<unsigned_char> message;
  undefined1 local_210 [32];
  size_t maxSize_local;
  anon_class_96_10_18673444_for_func *local_1e8;
  Vector<kj::Array<unsigned_char>_> *__range4;
  undefined8 local_1d8;
  undefined8 local_1d0;
  size_t payloadLen;
  anon_class_96_10_18673444_for_func handleMessage;
  
  if (*(char *)(maxSize + 0x178) == '\x01') {
    Exception::Exception((Exception *)&handleMessage,(Exception *)(maxSize + 0x180));
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
              ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               this,(Exception *)&handleMessage);
    Exception::~Exception((Exception *)&handleMessage);
    return (PromiseBase)(PromiseBase)this;
  }
  __src = *(byte **)(maxSize + 0x398);
  uVar11 = *(ulong *)(maxSize + 0x3a0);
  if (uVar11 < 2) {
    uVar6 = 2;
  }
  else {
    lVar9 = (ulong)(__src[1] >> 7) * 4;
    uVar6 = lVar9 + 2;
    bVar8 = __src[1] & 0x7f;
    if (bVar8 == 0x7e) {
      uVar6 = lVar9 + 4;
    }
    else if (bVar8 == 0x7f) {
      uVar6 = uVar6 | 8;
    }
  }
  lVar9 = uVar11 - uVar6;
  if (uVar11 < uVar6) {
    __dest_00 = *(byte **)(maxSize + 0x380);
    maxSize_local = (size_t)in_RDX;
    if (__src != __dest_00) {
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        memmove(__dest_00,__src,uVar11);
        __dest_00 = *(byte **)(maxSize + 0x380);
        uVar11 = *(ulong *)(maxSize + 0x3a0);
      }
      *(byte **)(maxSize + 0x398) = __dest_00;
      *(ulong *)(maxSize + 0x3a0) = uVar11;
      __src = __dest_00;
    }
    (**(code **)(**(long **)(maxSize + 0x18) + 8))
              (&local_250,*(long **)(maxSize + 0x18),__src + uVar11,1,
               __dest_00 + (*(long *)(maxSize + 0x388) - (long)(__src + uVar11)));
    local_210._8_8_ = maxSize_local;
    message.ptr = (uchar *)kj::_::
                           SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2708:17)>
                           ::anon_class_16_2_007aca32_for_func::operator();
    p_Var1 = local_250._vptr_WebSocket[1];
    if (p_Var1 == (_func_int *)0x0 || (ulong)((long)local_250._vptr_WebSocket - (long)p_Var1) < 0x30
       ) {
      local_210._0_8_ = maxSize;
      pvVar7 = operator_new(0x400);
      location_02 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2708:17)>
                     *)((long)pvVar7 + 0x3d0);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_250,
                 (anon_class_16_2_007aca32_for_func *)local_210,&message.ptr);
      *(void **)((long)pvVar7 + 0x3d8) = pvVar7;
    }
    else {
      local_250._vptr_WebSocket[1] = (_func_int *)0x0;
      location_02 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2708:17)>
                     *)(local_250._vptr_WebSocket + -6);
      local_210._0_8_ = maxSize;
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_250,
                 (anon_class_16_2_007aca32_for_func *)local_210,&message.ptr);
      local_250._vptr_WebSocket[-5] = p_Var1;
    }
    handleMessage.this = (WebSocketImpl *)&DAT_0042a172;
    handleMessage._8_8_ = &DAT_0042a1d1;
    handleMessage.payloadTarget = (byte *)0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_02;
    kj::_::maybeChain<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
              ((OwnPromiseNode *)(local_210 + 0x18),
               (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               &intermediate,location);
    uVar4 = local_210._24_8_;
    local_210._24_8_ = (AsyncIoStream *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_210 + 0x18));
    (this->super_WebSocket)._vptr_WebSocket = (_func_int **)uVar4;
    intermediate_1.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_250);
    return (PromiseBase)(PromiseBase)this;
  }
  code = (uint16_t)maxSize;
  if ((*__src & 0x30) != 0) {
    pcVar10 = "Received frame had RSV bits 2 or 3 set";
LAB_0036f65c:
    reason.content.size_ = (size_t)pcVar10;
    reason.content.ptr = (char *)0x3ea;
    sendCloseDueToError(this,code,reason);
    return (PromiseBase)(PromiseBase)this;
  }
  *(byte **)(maxSize + 0x398) = __src + uVar6;
  *(long *)(maxSize + 0x3a0) = lVar9;
  count = (anon_class_96_10_18673444_for_func *)(ulong)(__src[1] & 0x7f);
  if (count == (anon_class_96_10_18673444_for_func *)0x7e) {
    count = (anon_class_96_10_18673444_for_func *)
            (ulong)(ushort)(*(ushort *)(__src + 2) << 8 | *(ushort *)(__src + 2) >> 8);
  }
  else if ((__src[1] & 0x7f) == 0x7f) {
    uVar11 = *(ulong *)(__src + 2);
    count = (anon_class_96_10_18673444_for_func *)
            (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
            uVar11 << 0x38);
  }
  payloadLen = (size_t)count;
  if (in_RDX.value < count) {
    str<char_const(&)[23],unsigned_long&,char_const(&)[4],unsigned_long&>
              ((String *)&handleMessage,(kj *)"Message is too large: ",(char (*) [23])&payloadLen,
               (unsigned_long *)" > ",(char (*) [4])&maxSize_local,in_R9);
    if (handleMessage._8_8_ == 0) {
      handleMessage.this = (WebSocketImpl *)0x4706a1;
    }
    reason_00.content.size_ = (size_t)handleMessage.this;
    reason_00.content.ptr = (char *)0x3f1;
    sendCloseDueToError((WebSocketImpl *)local_210,code,reason_00);
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    attach<kj::String>((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                        *)this,(String *)local_210);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_210);
    Array<char>::~Array((Array<char> *)&handleMessage);
    return (PromiseBase)(PromiseBase)this;
  }
  bVar8 = *__src;
  bVar5 = bVar8 & 0xf;
  if (bVar5 == 0) {
    if (*(long *)(maxSize + 0x368) == *(long *)(maxSize + 0x360)) {
      pcVar10 = "Unexpected continuation frame";
      goto LAB_0036f65c;
    }
    local_252 = *(byte *)(maxSize + 0x358);
    lVar9 = CONCAT71((int7)((ulong)*(long *)(maxSize + 0x368) >> 8),local_252);
  }
  else {
    local_252 = bVar5;
    if ((bVar5 < 8) && (lVar9 = *(long *)(maxSize + 0x368), lVar9 != *(long *)(maxSize + 0x360))) {
      pcVar10 = "Missing continuation frame";
      goto LAB_0036f65c;
    }
  }
  message.disposer = (ArrayDisposer *)0x0;
  message.ptr = (uchar *)0x0;
  message.size_ = 0;
  if ((char)bVar8 < '\0') {
    local_244 = (undefined4)CONCAT71((int7)((ulong)lVar9 >> 8),1);
    uVar11 = 4;
    if (((*__src & 0x40) == 0) && (*(char *)(maxSize + 0x35c) == '\0')) {
      uVar11 = (ulong)(local_252 == 1);
      local_244 = 0;
    }
    sVar12 = (long)&((anon_class_96_10_18673444_for_func *)(&count->mask + -8))->this + uVar11;
    if (bVar5 < 8) {
      lVar9 = *(long *)(maxSize + 0x360);
      if (*(long *)(maxSize + 0x368) != lVar9) {
        __range4 = (Vector<kj::Array<unsigned_char>_> *)(maxSize + 0x360);
        local_1d8 = 0;
        for (; lVar9 != *(long *)(maxSize + 0x368); lVar9 = lVar9 + 0x18) {
          local_1d8 = local_1d8 + *(long *)(lVar9 + 8);
        }
        sVar12 = sVar12 + local_1d8;
        handleMessage.this =
             (WebSocketImpl *)kj::_::HeapArrayDisposer::allocate<unsigned_char>(sVar12);
        handleMessage.payloadTarget = (byte *)&kj::_::HeapArrayDisposer::instance;
        local_1e8 = count;
        handleMessage._8_8_ = sVar12;
        Array<unsigned_char>::operator=(&message,(Array<unsigned_char> *)&handleMessage);
        Array<unsigned_char>::~Array((Array<unsigned_char> *)&handleMessage);
        local_1d0 = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(maxSize + 0x368)
                    )->value;
        lVar9 = 0;
        for (aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                      ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                      (maxSize + 0x360))->value; aVar13.value != local_1d0;
            aVar13.value = aVar13.value + 0x18) {
          memcpy(message.ptr + lVar9,*(void **)aVar13,*(size_t *)(aVar13.value + 8));
          lVar9 = lVar9 + *(long *)(aVar13.value + 8);
        }
        in_RDX.value = local_1d8 + in_RDX.value;
        __dest = message.ptr + lVar9;
        ArrayBuilder<kj::Array<unsigned_char>_>::clear(&__range4->builder);
        *(undefined4 *)(maxSize + 0x358) = 0;
        *(undefined1 *)(maxSize + 0x35c) = 0;
        handleMessage.originalMaxSize.ptr.isSet = true;
        count = local_1e8;
        goto LAB_0036fb73;
      }
    }
    handleMessage.this = (WebSocketImpl *)kj::_::HeapArrayDisposer::allocate<unsigned_char>(sVar12);
    handleMessage.payloadTarget = (byte *)&kj::_::HeapArrayDisposer::instance;
    handleMessage._8_8_ = sVar12;
    Array<unsigned_char>::operator=(&message,(Array<unsigned_char> *)&handleMessage);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&handleMessage);
    handleMessage.originalMaxSize.ptr.isSet = true;
    __dest = message.ptr;
  }
  else {
    if (7 < bVar5) {
      reason_01.content.size_ = (size_t)"Received fragmented control frame";
      reason_01.content.ptr = (char *)0x3ea;
      sendCloseDueToError(this,code,reason_01);
      goto LAB_0036fe7a;
    }
    handleMessage.this =
         (WebSocketImpl *)kj::_::HeapArrayDisposer::allocate<unsigned_char>((size_t)count);
    handleMessage.payloadTarget = (byte *)&kj::_::HeapArrayDisposer::instance;
    handleMessage._8_8_ = count;
    Array<unsigned_char>::operator=(&message,(Array<unsigned_char> *)&handleMessage);
    in_RDX.value = (unsigned_long)&handleMessage;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)in_RDX);
    if (*(long *)(maxSize + 0x368) == *(long *)(maxSize + 0x360)) {
      *(uint *)(maxSize + 0x358) = (uint)local_252;
      *(byte *)(maxSize + 0x35c) = *__src >> 6 & 1;
    }
    handleMessage.originalMaxSize.ptr.isSet = false;
    local_244 = 0;
    __dest = message.ptr;
  }
LAB_0036fb73:
  handleMessage.isFin = (bool)(bVar8 >> 7);
  handleMessage.mask.maskBytes[0] = '\0';
  handleMessage.mask.maskBytes[1] = '\0';
  handleMessage.mask.maskBytes[2] = '\0';
  handleMessage.mask.maskBytes[3] = '\0';
  if ((char)__src[1] < '\0') {
    bVar8 = __src[1] & 0x7f;
    lVar9 = 10;
    if (bVar8 != 0x7f) {
      lVar9 = (ulong)(bVar8 == 0x7e) * 2 + 2;
    }
    handleMessage.mask.maskBytes = *(byte (*) [4])(__src + lVar9);
  }
  handleMessage.opcode = local_252;
  if (handleMessage.originalMaxSize.ptr.isSet != false) {
    handleMessage.originalMaxSize.ptr.field_1 = in_RDX;
  }
  handleMessage.isCompressed = SUB41(local_244,0);
  handleMessage.message.ptr = message.ptr;
  handleMessage.message.size_ = message.size_;
  handleMessage.message.disposer = message.disposer;
  message.ptr = (uchar *)0x0;
  message.size_ = 0;
  handleMessage.this = (WebSocketImpl *)maxSize;
  handleMessage.payloadTarget = __dest;
  handleMessage.payloadLen = (size_t)count;
  if (*(anon_class_96_10_18673444_for_func **)(maxSize + 0x3a0) < count) {
    memcpy(__dest,*(void **)(maxSize + 0x398),
           (size_t)*(anon_class_96_10_18673444_for_func **)(maxSize + 0x3a0));
    pp_Var14 = (_func_int **)((long)count - *(long *)(maxSize + 0x3a0));
    (**(code **)(**(long **)(maxSize + 0x18) + 8))
              (&local_250,*(long **)(maxSize + 0x18),__dest + *(long *)(maxSize + 0x3a0),pp_Var14,
               pp_Var14);
    WVar2._vptr_WebSocket = local_250._vptr_WebSocket;
    intermediate.ptr =
         (PromiseNode *)
         kj::_::
         SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2937:17)>
         ::anon_class_16_2_99444263_for_func::operator();
    p_Var1 = local_250._vptr_WebSocket[1];
    local_210._8_8_ = pp_Var14;
    if (p_Var1 == (_func_int *)0x0 || (ulong)((long)local_250._vptr_WebSocket - (long)p_Var1) < 0x30
       ) {
      local_210._0_8_ = maxSize;
      pvVar7 = operator_new(0x400);
      location_01.node.ptr = (OwnPromiseNode)((long)pvVar7 + 0x3d0);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_2_,void*&>
                ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2937:17)>
                  *)location_01.node.ptr,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_250,
                 (anon_class_16_2_99444263_for_func *)local_210,&intermediate.ptr);
      *(void **)((long)pvVar7 + 0x3d8) = pvVar7;
    }
    else {
      local_250._vptr_WebSocket[1] = (_func_int *)0x0;
      location_01.node.ptr = (OwnPromiseNode)(local_250._vptr_WebSocket + -6);
      local_210._0_8_ = maxSize;
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_2_,void*&>
                ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2937:17)>
                  *)location_01.node.ptr,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_250,
                 (anon_class_16_2_99444263_for_func *)local_210,&intermediate.ptr);
      WVar2._vptr_WebSocket[-5] = p_Var1;
    }
    intermediate_1.ptr = (PromiseNode *)0x0;
    local_210._24_8_ = (AsyncIoStream *)0x0;
    promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location_01.node.ptr;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_210 + 0x18));
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_250);
    PVar3 = promise;
    *(undefined8 *)(maxSize + 0x398) = 0;
    *(undefined8 *)(maxSize + 0x3a0) = 0;
    intermediate.ptr =
         (PromiseNode *)
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2811:9)>
         ::anon_class_96_10_18673444_for_func::operator();
    lVar9 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
    if (lVar9 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar9) < 0x80) {
      pvVar7 = operator_new(0x400);
      location_03 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2811:9)>
                     *)((long)pvVar7 + 0x380);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_,void*&>
                (location_03,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                 &handleMessage,&intermediate.ptr);
      *(void **)((long)pvVar7 + 0x388) = pvVar7;
    }
    else {
      *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
      location_03 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2811:9)>
                     *)((long)promise.super_PromiseBase.node.ptr + -0x80);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_,void*&>
                (location_03,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                 &handleMessage,&intermediate.ptr);
      *(long *)((long)PVar3.super_PromiseBase.node.ptr + -0x78) = lVar9;
    }
    local_210._0_8_ = &DAT_0042a172;
    local_210._8_8_ = &DAT_0042a1d1;
    local_210._16_8_ = (ArrayDisposer *)0x4c0000058b;
    location_00.function = &DAT_0042a1d1;
    location_00.fileName = &DAT_0042a172;
    location_00.lineNumber = 0x58b;
    location_00.columnNumber = 0x4c;
    intermediate_1.ptr = (PromiseNode *)location_03;
    kj::_::maybeChain<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
              ((OwnPromiseNode *)&local_250,
               (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               &intermediate_1,location_00);
    WVar2._vptr_WebSocket = local_250._vptr_WebSocket;
    local_250._vptr_WebSocket = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_250);
    (this->super_WebSocket)._vptr_WebSocket = WVar2._vptr_WebSocket;
    local_210._24_8_ = (AsyncIoStream *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_210 + 0x18));
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  }
  else {
    memcpy(__dest,*(void **)(maxSize + 0x398),(size_t)count);
    *(long *)(maxSize + 0x398) =
         (long)&((anon_class_96_10_18673444_for_func *)(&count->mask + -8))->this +
         *(long *)(maxSize + 0x398);
    *(long *)(maxSize + 0x3a0) = *(long *)(maxSize + 0x3a0) - (long)count;
    kj::_::
    SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2811:9)>
    ::anon_class_96_10_18673444_for_func::operator()((anon_class_96_10_18673444_for_func *)this);
  }
  Array<unsigned_char>::~Array(&handleMessage.message);
LAB_0036fe7a:
  Array<unsigned_char>::~Array(&message);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> receive(size_t maxSize) override {
    KJ_IF_SOME(ex, receiveException) {
      return kj::cp(ex);
    }

    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.first(recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this,maxSize](size_t actual) -> kj::Promise<Message> {
        receivedBytes += actual;
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.first(recvData.size() + actual);
        return receive(maxSize);
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());
    if (recvHeader.hasRsv2or3()) {
      return sendCloseDueToError(1002, "Received frame had RSV bits 2 or 3 set");
    }

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();
    if (payloadLen > maxSize) {
      auto description = kj::str("Message is too large: ", payloadLen, " > ", maxSize);
      return sendCloseDueToError(1009, description.asPtr()).attach(kj::mv(description));
    }

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      if (fragments.empty()) {
        return sendCloseDueToError(1002, "Unexpected continuation frame");
      }

      opcode = fragmentOpcode;
    } else if (isData) {
      if (!fragments.empty()) {
        return sendCloseDueToError(1002, "Missing continuation frame");
      }
    }

    bool isFin = recvHeader.isFin();
    bool isCompressed = false;

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    kj::Maybe<size_t> originalMaxSize; // maxSize from first `receive()` call
    if (isFin) {
      size_t amountToAllocate;
      if (recvHeader.isCompressed() || fragmentCompressed) {
        // Add 4 since we append 0x00 0x00 0xFF 0xFF to the tail of the payload.
        // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
        amountToAllocate = payloadLen + 4;
        isCompressed = true;
      } else {
        // Add space for NUL terminator when allocating text message.
        amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);
      }

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);
        originalMaxSize = offset + maxSize; // gives us back the original maximum message size.

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
        fragmentCompressed = false;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        originalMaxSize = maxSize; // gives us back the original maximum message size.
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      if (!isData) {
        return sendCloseDueToError(1002, "Received fragmented control frame");
      }

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
        fragmentCompressed = recvHeader.isCompressed();
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage =
        [this,opcode,payloadTarget,payloadLen,mask,isFin,maxSize,originalMaxSize,
         isCompressed,message=kj::mv(message)]() mutable
        -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        auto newMax = maxSize - message.size();
        fragments.add(kj::mv(message));
        return receive(newMax);
      }

      // Provide a reasonable error if a compressed frame is received without compression enabled.
      if (isCompressed && compressionConfig == kj::none) {
        return sendCloseDueToError(
            1002,
            "Received a WebSocket frame whose compression bit was set, but the compression "
            "extension was not negotiated for this connection.");
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            bool addNullTerminator = true;
            // We want to add the null terminator when receiving a TEXT message.
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize,
                addNullTerminator);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(kj::String(decompressed.releaseAsChars()));
              }
            }
          }
#endif // KJ_HAS_ZLIB
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(decompressed.releaseAsBytes());
              }
            }
          }
#endif // KJ_HAS_ZLIB
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive(maxSize);
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive(maxSize);
        default:
          {
            auto description = kj::str("Unknown opcode ", opcode);
            return sendCloseDueToError(1002, description.asPtr()).attach(kj::mv(description));
          }
      }
    };

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([this, remaining](size_t amount) {
        receivedBytes += amount;
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }